

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_no_run_on_unref(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t timer_handle;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer_handle);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_timer_start(&timer_handle,abort,0,0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      uv_unref((uv_handle_t *)&timer_handle);
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        eval_a = 0;
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        eval_b = (int64_t)iVar1;
        if (eval_b == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "uv_loop_close(uv_default_loop())";
        pcVar4 = "0";
        uVar3 = 0x1c3;
      }
      else {
        pcVar5 = "0";
        pcVar4 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
        uVar3 = 0x1c1;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "uv_timer_start(&timer_handle, (uv_timer_cb) abort, 0, 0)";
      uVar3 = 0x1bf;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "uv_timer_init(uv_default_loop(), &timer_handle)";
    uVar3 = 0x1be;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(timer_no_run_on_unref) {
  uv_timer_t timer_handle;

  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_timer_start(&timer_handle, (uv_timer_cb) abort, 0, 0));
  uv_unref((uv_handle_t*) &timer_handle);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}